

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O0

int64_t __thiscall IntView<5>::getShadowVal(IntView<5> *this)

{
  int iVar1;
  IntVar *in_RDI;
  int64_t v;
  
  iVar1 = IntVar::getShadowVal(in_RDI);
  return (long)(in_RDI->min).v + (long)-iVar1;
}

Assistant:

int64_t getShadowVal() const {
		int64_t v = (type & 1) != 0 ? -var->getShadowVal() : var->getShadowVal();
		if ((type & 2) != 0) {
			v *= a;
		}
		if ((type & 4) != 0) {
			v += b;
		}
		return v;
	}